

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_open_closeonexec_(char *pathname,int flags,uint mode)

{
  int iVar1;
  int *piVar2;
  int fd;
  uint mode_local;
  int flags_local;
  char *pathname_local;
  
  pathname_local._4_4_ = open(pathname,flags | 0x80000,(ulong)mode);
  if ((pathname_local._4_4_ < 0) && (piVar2 = __errno_location(), *piVar2 != 0x16)) {
    pathname_local._4_4_ = open(pathname,flags,(ulong)mode);
    if (pathname_local._4_4_ < 0) {
      pathname_local._4_4_ = -1;
    }
    else {
      iVar1 = fcntl(pathname_local._4_4_,2,1);
      if (iVar1 < 0) {
        close(pathname_local._4_4_);
        pathname_local._4_4_ = -1;
      }
    }
  }
  return pathname_local._4_4_;
}

Assistant:

int
evutil_open_closeonexec_(const char *pathname, int flags, unsigned mode)
{
	int fd;

#ifdef O_CLOEXEC
	fd = open(pathname, flags|O_CLOEXEC, (mode_t)mode);
	if (fd >= 0 || errno == EINVAL)
		return fd;
	/* If we got an EINVAL, fall through and try without O_CLOEXEC */
#endif
	fd = open(pathname, flags, (mode_t)mode);
	if (fd < 0)
		return -1;

#if defined(FD_CLOEXEC)
	if (fcntl(fd, F_SETFD, FD_CLOEXEC) < 0) {
		close(fd);
		return -1;
	}
#endif

	return fd;
}